

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::TraverseSchema::fixRedefinedSchema
          (TraverseSchema *this,DOMElement *elem,SchemaInfo *redefinedSchemaInfo,
          XMLCh *redefineChildComponentName,XMLCh *redefineChildTypeName,int redefineNameCounter)

{
  XMLCh XVar1;
  XMLCh XVar2;
  SchemaInfo *redefinedSchemaInfo_00;
  XMLStringPool *pXVar3;
  MemoryManager *pMVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  DOMNode *parent;
  undefined4 extraout_var;
  DOMNode *node;
  undefined4 extraout_var_00;
  XMLCh *pXVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ValueVectorOf<const_xercesc_4_0::DOMElement_*> *pVVar9;
  undefined4 extraout_var_03;
  XMLSize_t XVar10;
  XMLCh *pXVar11;
  XMLCh *pXVar12;
  XMLBuffer *pXVar13;
  
  parent = &XUtil::getFirstChildElement(&redefinedSchemaInfo->fSchemaRootElement->super_DOMNode)->
            super_DOMNode;
  this->fSchemaInfo = redefinedSchemaInfo;
  do {
    if (parent == (DOMNode *)0x0) {
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x7d,
                        redefineChildTypeName,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      return;
    }
    iVar6 = (*parent->_vptr_DOMNode[0x18])(parent);
    pXVar8 = (XMLCh *)CONCAT44(extraout_var,iVar6);
    if (pXVar8 == redefineChildComponentName) {
LAB_00334929:
      pXVar8 = getElementAttValue(this,(DOMElement *)parent,(XMLCh *)SchemaSymbols::fgATT_NAME,
                                  NCName);
      if (pXVar8 == redefineChildTypeName) {
LAB_00334cc6:
        (this->fBuffer).fIndex = 0;
        if ((pXVar8 != (XMLCh *)0x0) && (*pXVar8 != L'\0')) {
          XMLBuffer::append(&this->fBuffer,pXVar8);
        }
LAB_00334ead:
        if (0 < redefineNameCounter) {
          do {
            XMLBuffer::append(&this->fBuffer,(XMLCh *)SchemaSymbols::fgRedefIdentifier);
            redefineNameCounter = redefineNameCounter + -1;
          } while (redefineNameCounter != 0);
        }
        (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
        (*parent->_vptr_DOMNode[0x2c])(parent,SchemaSymbols::fgATT_NAME);
        return;
      }
      pXVar11 = redefineChildTypeName;
      if ((redefineChildTypeName == (XMLCh *)0x0) || (pXVar12 = pXVar8, pXVar8 == (XMLCh *)0x0)) {
        if (pXVar8 == (XMLCh *)0x0) {
          if (redefineChildTypeName == (XMLCh *)0x0) {
LAB_00334e9a:
            (this->fBuffer).fIndex = 0;
            goto LAB_00334ead;
          }
        }
        else if ((redefineChildTypeName == (XMLCh *)0x0) || (*pXVar8 != L'\0')) {
          if (*pXVar8 == L'\0') goto LAB_00334e9a;
          goto LAB_00334ad4;
        }
LAB_00334aca:
        if (*pXVar11 == L'\0') goto LAB_00334cc6;
      }
      else {
        do {
          XVar1 = *pXVar12;
          if (XVar1 == L'\0') goto LAB_00334aca;
          pXVar12 = pXVar12 + 1;
          XVar2 = *pXVar11;
          pXVar11 = pXVar11 + 1;
        } while (XVar1 == XVar2);
      }
      goto LAB_00334ad4;
    }
    pXVar11 = redefineChildComponentName;
    if ((redefineChildComponentName == (XMLCh *)0x0) || (pXVar12 = pXVar8, pXVar8 == (XMLCh *)0x0))
    {
      if (pXVar8 == (XMLCh *)0x0) {
        if (redefineChildComponentName == (XMLCh *)0x0) goto LAB_00334929;
LAB_003348de:
        if (*pXVar11 == L'\0') goto LAB_00334929;
        goto LAB_003348e4;
      }
      if ((redefineChildComponentName != (XMLCh *)0x0) && (*pXVar8 == L'\0')) goto LAB_003348de;
      if (*pXVar8 == L'\0') goto LAB_00334929;
      if (pXVar8 != L"redefine") goto LAB_00334901;
LAB_003349b1:
      for (node = &XUtil::getFirstChildElement(parent)->super_DOMNode; node != (DOMNode *)0x0;
          node = &XUtil::getNextSiblingElement(node)->super_DOMNode) {
        iVar6 = (*node->_vptr_DOMNode[0x18])(node);
        pXVar8 = (XMLCh *)CONCAT44(extraout_var_00,iVar6);
        if (pXVar8 == redefineChildComponentName) {
LAB_00334a2f:
          pXVar8 = getElementAttValue(this,(DOMElement *)node,(XMLCh *)SchemaSymbols::fgATT_NAME,
                                      NCName);
          if (pXVar8 == redefineChildTypeName) goto LAB_00334b15;
          pXVar11 = redefineChildTypeName;
          if ((redefineChildTypeName != (XMLCh *)0x0) && (pXVar12 = pXVar8, pXVar8 != (XMLCh *)0x0))
          {
            do {
              XVar1 = *pXVar12;
              if (XVar1 == L'\0') goto LAB_00334aa2;
              pXVar12 = pXVar12 + 1;
              XVar2 = *pXVar11;
              pXVar11 = pXVar11 + 1;
            } while (XVar1 == XVar2);
            goto LAB_00334aa8;
          }
          if (pXVar8 == (XMLCh *)0x0) {
            if (redefineChildTypeName == (XMLCh *)0x0) goto LAB_00334b15;
LAB_00334aa2:
            XVar1 = *pXVar11;
          }
          else {
            XVar1 = *pXVar8;
            if ((redefineChildTypeName != (XMLCh *)0x0) && (XVar1 == L'\0')) goto LAB_00334aa2;
          }
          if (XVar1 == L'\0') {
LAB_00334b15:
            bVar5 = openRedefinedSchema(this,(DOMElement *)parent);
            if (!bVar5) {
              pVVar9 = redefinedSchemaInfo->fFailedRedefineList;
              if (pVVar9 == (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0) {
                pVVar9 = (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)
                         XMemory::operator_new(0x28,redefinedSchemaInfo->fMemoryManager);
                pMVar4 = redefinedSchemaInfo->fMemoryManager;
                pVVar9->fCallDestructor = false;
                pVVar9->fCurCount = 0;
                pVVar9->fMaxCount = 4;
                pVVar9->fElemList = (DOMElement **)0x0;
                pVVar9->fMemoryManager = pMVar4;
                iVar6 = (*pMVar4->_vptr_MemoryManager[3])();
                pVVar9->fElemList = (DOMElement **)CONCAT44(extraout_var_02,iVar6);
                memset((DOMElement **)CONCAT44(extraout_var_02,iVar6),0,pVVar9->fMaxCount << 3);
                redefinedSchemaInfo->fFailedRedefineList = pVVar9;
              }
              ValueVectorOf<const_xercesc_4_0::DOMElement_*>::ensureExtraCapacity(pVVar9,1);
              XVar10 = pVVar9->fCurCount;
              pVVar9->fCurCount = XVar10 + 1;
              pVVar9->fElemList[XVar10] = (DOMElement *)parent;
              return;
            }
            redefinedSchemaInfo_00 = this->fSchemaInfo;
            bVar5 = validateRedefineNameChange
                              (this,(DOMElement *)node,redefineChildComponentName,
                               redefineChildTypeName,redefineNameCounter + 1,redefinedSchemaInfo);
            if (bVar5) {
              fixRedefinedSchema(this,(DOMElement *)node,redefinedSchemaInfo_00,
                                 redefineChildComponentName,redefineChildTypeName,
                                 redefineNameCounter + 1);
              pXVar13 = &this->fBuffer;
              (this->fBuffer).fIndex = 0;
              if ((pXVar8 != (XMLCh *)0x0) && (*pXVar8 != L'\0')) {
                XMLBuffer::append(pXVar13,pXVar8);
              }
              if (0 < redefineNameCounter) {
                do {
                  XMLBuffer::append(pXVar13,(XMLCh *)SchemaSymbols::fgRedefIdentifier);
                  redefineNameCounter = redefineNameCounter + -1;
                } while (redefineNameCounter != 0);
              }
              pXVar3 = this->fStringPool;
              (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
              uVar7 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])(pXVar3);
              iVar6 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[10])(pXVar3,(ulong)uVar7);
              pXVar8 = (XMLCh *)CONCAT44(extraout_var_01,iVar6);
              (*node->_vptr_DOMNode[0x2c])(node,SchemaSymbols::fgATT_NAME,pXVar8);
              pXVar11 = this->fTargetNSURIString;
              (this->fBuffer).fIndex = 0;
              if ((pXVar11 == (XMLCh *)0x0) || (*pXVar11 == L'\0')) {
                XVar10 = 0;
              }
              else {
                XMLBuffer::append(pXVar13,pXVar11);
                XVar10 = pXVar13->fIndex;
              }
              if (XVar10 == (this->fBuffer).fCapacity) {
                XMLBuffer::ensureCapacity(pXVar13,1);
                XVar10 = pXVar13->fIndex;
              }
              (this->fBuffer).fIndex = XVar10 + 1;
              (this->fBuffer).fBuffer[XVar10] = L',';
            }
            else {
              fixRedefinedSchema(this,(DOMElement *)node,redefinedSchemaInfo_00,
                                 redefineChildComponentName,redefineChildTypeName,
                                 redefineNameCounter);
              pVVar9 = redefinedSchemaInfo->fFailedRedefineList;
              if (pVVar9 == (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0) {
                pVVar9 = (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)
                         XMemory::operator_new(0x28,redefinedSchemaInfo->fMemoryManager);
                pMVar4 = redefinedSchemaInfo->fMemoryManager;
                pVVar9->fCallDestructor = false;
                pVVar9->fCurCount = 0;
                pVVar9->fMaxCount = 4;
                pVVar9->fElemList = (DOMElement **)0x0;
                pVVar9->fMemoryManager = pMVar4;
                iVar6 = (*pMVar4->_vptr_MemoryManager[3])();
                pVVar9->fElemList = (DOMElement **)CONCAT44(extraout_var_03,iVar6);
                memset((DOMElement **)CONCAT44(extraout_var_03,iVar6),0,pVVar9->fMaxCount << 3);
                redefinedSchemaInfo->fFailedRedefineList = pVVar9;
              }
              ValueVectorOf<const_xercesc_4_0::DOMElement_*>::ensureExtraCapacity(pVVar9,1);
              XVar10 = pVVar9->fCurCount;
              pVVar9->fCurCount = XVar10 + 1;
              pVVar9->fElemList[XVar10] = (DOMElement *)node;
              pXVar13 = &this->fBuffer;
              pXVar11 = this->fTargetNSURIString;
              (this->fBuffer).fIndex = 0;
              if ((pXVar11 == (XMLCh *)0x0) || (*pXVar11 == L'\0')) {
                XVar10 = 0;
              }
              else {
                XMLBuffer::append(pXVar13,pXVar11);
                XVar10 = pXVar13->fIndex;
              }
              if (XVar10 == (this->fBuffer).fCapacity) {
                XMLBuffer::ensureCapacity(pXVar13,1);
                XVar10 = pXVar13->fIndex;
              }
              (this->fBuffer).fIndex = XVar10 + 1;
              (this->fBuffer).fBuffer[XVar10] = L',';
            }
            XMLBuffer::append(&this->fBuffer,pXVar8);
            pXVar3 = this->fStringPool;
            (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
            iVar6 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])();
            bVar5 = RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::containsKey
                              (this->fRedefineComponents,redefineChildComponentName,iVar6);
            if (bVar5) {
              return;
            }
            RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::put
                      (this->fRedefineComponents,redefineChildComponentName,iVar6,(char16_t *)0x0);
            return;
          }
        }
        else {
          pXVar11 = redefineChildComponentName;
          if ((redefineChildComponentName == (XMLCh *)0x0) || (pXVar8 == (XMLCh *)0x0)) {
            if (pXVar8 == (XMLCh *)0x0) {
              if (redefineChildComponentName == (XMLCh *)0x0) goto LAB_00334a2f;
LAB_00334a29:
              XVar1 = *pXVar11;
            }
            else {
              XVar1 = *pXVar8;
              if ((redefineChildComponentName != (XMLCh *)0x0) && (XVar1 == L'\0'))
              goto LAB_00334a29;
            }
            if (XVar1 == L'\0') goto LAB_00334a2f;
          }
          else {
            do {
              XVar1 = *pXVar8;
              if (XVar1 == L'\0') goto LAB_00334a29;
              pXVar8 = pXVar8 + 1;
              XVar2 = *pXVar11;
              pXVar11 = pXVar11 + 1;
            } while (XVar1 == XVar2);
          }
        }
LAB_00334aa8:
      }
    }
    else {
      do {
        XVar1 = *pXVar12;
        if (XVar1 == L'\0') goto LAB_003348de;
        pXVar12 = pXVar12 + 1;
        XVar2 = *pXVar11;
        pXVar11 = pXVar11 + 1;
      } while (XVar1 == XVar2);
LAB_003348e4:
      if (pXVar8 == L"redefine") goto LAB_003349b1;
      pXVar11 = L"redefine";
      if (pXVar8 == (XMLCh *)0x0) {
LAB_003349a7:
        if (*pXVar11 == L'\0') goto LAB_003349b1;
      }
      else {
LAB_00334901:
        pXVar11 = L"redefine";
        do {
          XVar1 = *pXVar8;
          if (XVar1 == L'\0') goto LAB_003349a7;
          pXVar8 = pXVar8 + 1;
          XVar2 = *pXVar11;
          pXVar11 = pXVar11 + 1;
        } while (XVar1 == XVar2);
      }
    }
LAB_00334ad4:
    parent = &XUtil::getNextSiblingElement(parent)->super_DOMNode;
  } while( true );
}

Assistant:

void TraverseSchema::fixRedefinedSchema(const DOMElement* const elem,
                                        SchemaInfo* const redefinedSchemaInfo,
                                        const XMLCh* const redefineChildComponentName,
                                        const XMLCh* const redefineChildTypeName,
                                        const int redefineNameCounter) {

    bool foundIt = false;
    DOMElement* child = XUtil::getFirstChildElement(redefinedSchemaInfo->getRoot());

    restoreSchemaInfo(redefinedSchemaInfo);

    for (; child != 0; child = XUtil::getNextSiblingElement(child)) {

        const XMLCh* name = child->getLocalName();

        if (XMLString::equals(name, redefineChildComponentName)) {

            const XMLCh* infoItemName = getElementAttValue(child, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

            if(!XMLString::equals(infoItemName, redefineChildTypeName)) {
                continue;
            }
            else { // found it!

                // now we have to do the renaming...
                foundIt = true;
                getRedefineNewTypeName(infoItemName, redefineNameCounter, fBuffer);
                child->setAttribute(SchemaSymbols::fgATT_NAME, fBuffer.getRawBuffer());
                break;
            }
        }
        else if (XMLString::equals(name, SchemaSymbols::fgELT_REDEFINE)) { // need to search the redefine decl...

            for (DOMElement* redefChild = XUtil::getFirstChildElement(child);
                 redefChild != 0;
                 redefChild = XUtil::getNextSiblingElement(redefChild)) {

                const XMLCh* redefName = redefChild->getLocalName();

                if (XMLString::equals(redefName, redefineChildComponentName)) {

                    const XMLCh* infoItemName = getElementAttValue(redefChild, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

                    if(!XMLString::equals(infoItemName, redefineChildTypeName)) {
                        continue;
                    }
                    else { // found it!

                        if (!openRedefinedSchema(child)) {

                            redefinedSchemaInfo->addFailedRedefine(child);
                            return;
                        }

                        foundIt = true;

                        SchemaInfo* reRedefinedSchemaInfo = fSchemaInfo;

                        if (validateRedefineNameChange(redefChild, redefineChildComponentName, redefineChildTypeName, redefineNameCounter + 1, redefinedSchemaInfo)) {

                            fixRedefinedSchema(redefChild, reRedefinedSchemaInfo, redefineChildComponentName, redefineChildTypeName, redefineNameCounter + 1);

                            // now we have to do the renaming...
                            getRedefineNewTypeName(infoItemName, redefineNameCounter, fBuffer);
                            const XMLCh* newInfoItemName = fStringPool->getValueForId(fStringPool->addOrFind(fBuffer.getRawBuffer()));
                            redefChild->setAttribute(SchemaSymbols::fgATT_NAME, newInfoItemName);

                            // and we now know we will traverse this, so set fRedefineComponents appropriately...
                            fBuffer.set(fTargetNSURIString);
                            fBuffer.append(chComma);
                            fBuffer.append(newInfoItemName);
                        }
                        else {

                            fixRedefinedSchema(redefChild, reRedefinedSchemaInfo, redefineChildComponentName, redefineChildTypeName, redefineNameCounter);
                            redefinedSchemaInfo->addFailedRedefine(redefChild);

                            // and we now know we will traverse this, so set fRedefineComponents appropriately...
                            fBuffer.set(fTargetNSURIString);
                            fBuffer.append(chComma);
                            fBuffer.append(infoItemName);
                        }

                        unsigned int infoItemNameId = fStringPool->addOrFind(fBuffer.getRawBuffer());

                        if (!fRedefineComponents->containsKey(redefineChildComponentName, infoItemNameId)) {
                            fRedefineComponents->put((void*) redefineChildComponentName, infoItemNameId, 0);
                        }

                        break;
                    }
                }
            } //for

            if (foundIt) {
                break;
            }
        }
    } //for

    if(!foundIt) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_DeclarationNotFound, redefineChildTypeName);
    }
}